

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobatto_polynomial.cpp
# Opt level: O2

void lobatto_polynomial_plot(int ndx_num,int *ndx,string *prefix)

{
  int iVar1;
  double *x;
  void *pvVar2;
  void *pvVar3;
  double *pdVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  void *pvVar12;
  ostream local_4e8 [8];
  ofstream data_unit;
  ostream local_2e8 [8];
  ofstream command_unit;
  size_type *local_e8;
  string plot_filename;
  string data_filename;
  string command_filename;
  ulong local_50;
  
  data_filename.field_2._8_8_ = &command_filename._M_string_length;
  command_filename._M_dataplus._M_p = (pointer)0x0;
  command_filename._M_string_length._0_1_ = 0;
  std::ofstream::ofstream(local_2e8);
  plot_filename.field_2._8_8_ = &data_filename._M_string_length;
  data_filename._M_dataplus._M_p = (pointer)0x0;
  data_filename._M_string_length._0_1_ = 0;
  std::ofstream::ofstream(local_4e8);
  local_e8 = &plot_filename._M_string_length;
  plot_filename._M_dataplus._M_p = (pointer)0x0;
  plot_filename._M_string_length._0_1_ = 0;
  x = r8vec_linspace_new(0x1f5,-1.0,1.0);
  uVar8 = 0xffffffffffffffff;
  if (-1 < ndx_num) {
    uVar8 = (long)(ndx_num * 0x1f5) << 3;
  }
  pvVar2 = operator_new__(uVar8);
  pvVar3 = operator_new__(uVar8);
  uVar8 = 0;
  local_50 = 0;
  pvVar12 = pvVar2;
  pvVar10 = pvVar3;
  if (0 < ndx_num) {
    local_50 = (ulong)(uint)ndx_num;
  }
  for (; uVar8 != local_50; uVar8 = uVar8 + 1) {
    iVar11 = ndx[uVar8];
    pdVar4 = lobatto_polynomial_value(0x1f5,iVar11,x);
    lVar9 = (long)(iVar11 * 0x1f5 + -0x1f5);
    for (lVar6 = 0; lVar6 != 0x1f5; lVar6 = lVar6 + 1) {
      *(double *)((long)pvVar12 + lVar6 * 8) = pdVar4[lVar9 + lVar6];
    }
    operator_delete__(pdVar4);
    pdVar4 = lobatto_polynomial_derivative(0x1f5,iVar11,x);
    for (lVar6 = 0; lVar6 != 0x1f5; lVar6 = lVar6 + 1) {
      *(double *)((long)pvVar10 + lVar6 * 8) = pdVar4[lVar9 + lVar6];
    }
    operator_delete__(pdVar4);
    pvVar12 = (void *)((long)pvVar12 + 0xfa8);
    pvVar10 = (void *)((long)pvVar10 + 0xfa8);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command_filename.field_2 + 8),prefix,"_value_data.txt");
  std::__cxx11::string::operator=
            ((string *)(plot_filename.field_2._M_local_buf + 8),
             (string *)(command_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(command_filename.field_2._M_local_buf + 8));
  std::ofstream::open((char *)local_4e8,(_Ios_Openmode)plot_filename.field_2._8_8_);
  pvVar12 = pvVar2;
  for (lVar6 = 0; lVar6 != 0x1f5; lVar6 = lVar6 + 1) {
    std::ostream::_M_insert<double>(x[lVar6]);
    for (lVar9 = 0; local_50 * 0xfa8 - lVar9 != 0; lVar9 = lVar9 + 0xfa8) {
      std::operator<<(local_4e8,"  ");
      std::ostream::_M_insert<double>(*(double *)((long)pvVar12 + lVar9));
    }
    std::operator<<(local_4e8,"\n");
    pvVar12 = (void *)((long)pvVar12 + 8);
  }
  std::ofstream::close();
  poVar5 = std::operator<<((ostream *)&std::cout,"  Lobatto value data in \'");
  poVar5 = std::operator<<(poVar5,(string *)(plot_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\'\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command_filename.field_2 + 8),prefix,"_value_commands.txt");
  std::__cxx11::string::operator=
            ((string *)(data_filename.field_2._M_local_buf + 8),
             (string *)(command_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(command_filename.field_2._M_local_buf + 8));
  std::ofstream::open((char *)local_2e8,(_Ios_Openmode)data_filename.field_2._8_8_);
  poVar5 = std::operator<<(local_2e8,"# ");
  poVar5 = std::operator<<(poVar5,(string *)(data_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\n");
  std::operator<<(local_2e8,"#\n");
  std::operator<<(local_2e8,"# Usage:\n");
  poVar5 = std::operator<<(local_2e8,"#  gnuplot < ");
  poVar5 = std::operator<<(poVar5,(string *)(data_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\n");
  std::operator<<(local_2e8,"#\n");
  std::operator<<(local_2e8,"unset key\n");
  std::operator<<(local_2e8,"set term png\n");
  std::operator<<(local_2e8,"set timestamp\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command_filename.field_2 + 8),prefix,"_value.png");
  std::__cxx11::string::operator=
            ((string *)&local_e8,(string *)(command_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(command_filename.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(local_2e8,"set output \'");
  poVar5 = std::operator<<(poVar5,(string *)&local_e8);
  std::operator<<(poVar5,"\'\n");
  std::operator<<(local_2e8,"set xlabel \'x\'\n");
  std::operator<<(local_2e8,"set ylabel \'L(n,x)\'\n");
  std::operator<<(local_2e8,"set title \'Lobatto values\'\n");
  std::operator<<(local_2e8,"set grid\n");
  std::operator<<(local_2e8,"set style data lines\n");
  iVar11 = 0;
  uVar8 = local_50;
  while (iVar1 = (int)uVar8, uVar8 = (ulong)(iVar1 - 1), iVar1 != 0) {
    pcVar7 = "     \'";
    if (iVar11 == 0) {
      pcVar7 = "plot \'";
    }
    std::operator<<(local_2e8,pcVar7);
    poVar5 = std::operator<<(local_2e8,(string *)(plot_filename.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"\' using 1:");
    std::ostream::operator<<(poVar5,iVar11 + 2);
    if (iVar11 < ndx_num + -1) {
      std::operator<<(local_2e8,", \\");
    }
    std::operator<<(local_2e8,"\n");
    iVar11 = iVar11 + 1;
  }
  std::operator<<(local_2e8,"quit\n");
  std::ofstream::close();
  poVar5 = std::operator<<((ostream *)&std::cout,"  Lobatto value commands in \'");
  poVar5 = std::operator<<(poVar5,(string *)(data_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\'\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command_filename.field_2 + 8),prefix,"_derivative_data.txt");
  std::__cxx11::string::operator=
            ((string *)(plot_filename.field_2._M_local_buf + 8),
             (string *)(command_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(command_filename.field_2._M_local_buf + 8));
  std::ofstream::open((char *)local_4e8,(_Ios_Openmode)plot_filename.field_2._8_8_);
  pvVar12 = pvVar3;
  for (lVar6 = 0; lVar6 != 0x1f5; lVar6 = lVar6 + 1) {
    std::ostream::_M_insert<double>(x[lVar6]);
    for (lVar9 = 0; local_50 * 0xfa8 - lVar9 != 0; lVar9 = lVar9 + 0xfa8) {
      std::operator<<(local_4e8,"  ");
      std::ostream::_M_insert<double>(*(double *)((long)pvVar12 + lVar9));
    }
    std::operator<<(local_4e8,"\n");
    pvVar12 = (void *)((long)pvVar12 + 8);
  }
  std::ofstream::close();
  poVar5 = std::operator<<((ostream *)&std::cout,"  Lobatto derivative data stored in \'");
  poVar5 = std::operator<<(poVar5,(string *)(plot_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\'\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command_filename.field_2 + 8),prefix,"_derivative_commands.txt");
  std::__cxx11::string::operator=
            ((string *)(data_filename.field_2._M_local_buf + 8),
             (string *)(command_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(command_filename.field_2._M_local_buf + 8));
  std::ofstream::open((char *)local_2e8,(_Ios_Openmode)data_filename.field_2._8_8_);
  poVar5 = std::operator<<(local_2e8,"# ");
  poVar5 = std::operator<<(poVar5,(string *)(data_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\n");
  std::operator<<(local_2e8,"#\n");
  std::operator<<(local_2e8,"# Usage:\n");
  poVar5 = std::operator<<(local_2e8,"#  gnuplot < ");
  poVar5 = std::operator<<(poVar5,(string *)(data_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\n");
  std::operator<<(local_2e8,"#\n");
  std::operator<<(local_2e8,"unset key\n");
  std::operator<<(local_2e8,"set term png\n");
  std::operator<<(local_2e8,"set timestamp\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&command_filename.field_2 + 8),prefix,"_derivative.png");
  std::__cxx11::string::operator=
            ((string *)&local_e8,(string *)(command_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(command_filename.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(local_2e8,"set output \'");
  poVar5 = std::operator<<(poVar5,(string *)&local_e8);
  std::operator<<(poVar5,"\'\n");
  std::operator<<(local_2e8,"set xlabel \'x\'\n");
  std::operator<<(local_2e8,"set ylabel \'L(n,x)\'\n");
  std::operator<<(local_2e8,"set title \'Lobatto derivatives\'\n");
  std::operator<<(local_2e8,"set grid\n");
  std::operator<<(local_2e8,"set style data lines\n");
  iVar11 = 0;
  while (iVar1 = (int)local_50, local_50 = (ulong)(iVar1 - 1), iVar1 != 0) {
    pcVar7 = "     \'";
    if (iVar11 == 0) {
      pcVar7 = "plot \'";
    }
    std::operator<<(local_2e8,pcVar7);
    poVar5 = std::operator<<(local_2e8,(string *)(plot_filename.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"\' using 1:");
    std::ostream::operator<<(poVar5,iVar11 + 2);
    if (iVar11 < ndx_num + -1) {
      std::operator<<(local_2e8,", \\");
    }
    std::operator<<(local_2e8,"\n");
    iVar11 = iVar11 + 1;
  }
  std::operator<<(local_2e8,"quit\n");
  std::ofstream::close();
  poVar5 = std::operator<<((ostream *)&std::cout,"  Lobatto derivative commands in \'");
  poVar5 = std::operator<<(poVar5,(string *)(data_filename.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\'\n");
  if (x != (double *)0x0) {
    operator_delete__(x);
  }
  operator_delete__(pvVar2);
  operator_delete__(pvVar3);
  std::__cxx11::string::~string((string *)&local_e8);
  std::ofstream::~ofstream(local_4e8);
  std::__cxx11::string::~string((string *)(plot_filename.field_2._M_local_buf + 8));
  std::ofstream::~ofstream(local_2e8);
  std::__cxx11::string::~string((string *)(data_filename.field_2._M_local_buf + 8));
  return;
}

Assistant:

void lobatto_polynomial_plot ( int ndx_num, int ndx[], std::string prefix )

//****************************************************************************80
//
//  Purpose:
//
//    LOBATTO_POLYNOMIAL_PLOT plots one or more completed Lobatto polynomials.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 November 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int NDX_NUM, the number of polynomials to plot.
//
//    Input, int NDX[NDX_NUM], the orders of 1 or more
//    Legendre polynomials to be plotted together.
//
//    Input, string PREFIX. the filename prefix.
//
{
  std::string command_filename;
  std::ofstream command_unit;
  std::string data_filename;
  std::ofstream data_unit;
  int i;
  int j;
  double *l;
  double *lp;
  int n;
  std::string plot_filename;
  double *x;
  double x_hi;
  double x_lo;
  static int x_num = 501;
  double *y;
  double *yp;

  x_lo = -1.0;
  x_hi = +1.0;
  x = r8vec_linspace_new ( x_num, x_lo, x_hi );
//
//  Collect the data.
//
  y = new double[x_num*ndx_num];
  yp = new double[x_num*ndx_num];

  for ( j = 0; j < ndx_num; j++ )
  {
    n = ndx[j];

    l = lobatto_polynomial_value ( x_num, n, x );
    for ( i = 0; i < x_num; i++ )
    {
      y[i+j*x_num] = l[i+(n-1)*x_num];
    }
    delete [] l;

    lp = lobatto_polynomial_derivative ( x_num, n, x );
    for ( i = 0; i < x_num; i++ )
    {
      yp[i+j*x_num] = lp[i+(n-1)*x_num];
    }
    delete [] lp;
  }

  std::cout << "\n";
//
//  Make data file for values.
//
  data_filename = prefix + "_value_data.txt";

  data_unit.open ( data_filename.c_str ( ) );

  for ( i = 0; i < x_num; i++ )
  {
    data_unit << x[i];
    for ( j = 0; j < ndx_num; j++ )
    {
      data_unit << "  " << y[i+j*x_num];
    }
    data_unit << "\n";
  }
  data_unit.close ( );

  std::cout << "  Lobatto value data in '" << data_filename << "'\n";
//
//  Make command file for values.
//
  command_filename = prefix + "_value_commands.txt";

  command_unit.open ( command_filename.c_str ( ) );

  command_unit << "# " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "# Usage:\n";
  command_unit << "#  gnuplot < " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "unset key\n";
  command_unit << "set term png\n";
  command_unit << "set timestamp\n";

  plot_filename = prefix + "_value.png";

  command_unit << "set output '" << plot_filename << "'\n";
  command_unit << "set xlabel 'x'\n";
  command_unit << "set ylabel 'L(n,x)'\n";
  command_unit << "set title 'Lobatto values'\n";
  command_unit << "set grid\n";
  command_unit << "set style data lines\n";
  for ( j = 0; j < ndx_num; j++ )
  {
    if ( j == 0 )
    {
      command_unit << "plot '";
    }
    else
    {
      command_unit << "     '";
    }
    command_unit << data_filename << "' using 1:" << j + 2;
    if ( j < ndx_num - 1 )
    {
      command_unit << ", \\";
    }
    command_unit << "\n";
  }
  command_unit << "quit\n";

  command_unit.close ( );

  std::cout << "  Lobatto value commands in '" << command_filename << "'\n";
//
//  Make data file for derivatives.
//
  data_filename = prefix + "_derivative_data.txt";

  data_unit.open ( data_filename.c_str ( ) );

  for ( i = 0; i < x_num; i++ )
  {
    data_unit << x[i];
    for ( j = 0; j < ndx_num; j++ )
    {
      data_unit << "  " << yp[i+j*x_num];
    }
    data_unit << "\n";
  }
  data_unit.close ( );

   std::cout << "  Lobatto derivative data stored in '" << data_filename << "'\n";
//
//  Make command file for derivatives.
//
  command_filename = prefix + "_derivative_commands.txt";

  command_unit.open ( command_filename.c_str ( ) );

  command_unit << "# " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "# Usage:\n";
  command_unit << "#  gnuplot < " << command_filename << "\n";
  command_unit << "#\n";
  command_unit << "unset key\n";
  command_unit << "set term png\n";
  command_unit << "set timestamp\n";

  plot_filename = prefix + "_derivative.png";

  command_unit << "set output '" << plot_filename << "'\n";
  command_unit << "set xlabel 'x'\n";
  command_unit << "set ylabel 'L(n,x)'\n";
  command_unit << "set title 'Lobatto derivatives'\n";
  command_unit << "set grid\n";
  command_unit << "set style data lines\n";
  for ( j = 0; j < ndx_num; j++ )
  {
    if ( j == 0 )
    {
      command_unit << "plot '";
    }
    else
    {
      command_unit << "     '";
    }
    command_unit << data_filename << "' using 1:" << j + 2;
    if ( j < ndx_num - 1 )
    {
      command_unit << ", \\";
    }
    command_unit << "\n";
  }
  command_unit << "quit\n";

  command_unit.close ( );

  std::cout << "  Lobatto derivative commands in '" << command_filename << "'\n";

  delete [] x;
  delete [] y;
  delete [] yp;

  return;
}